

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

VoidPromiseAndPipeline * __thiscall
capnp::LocalCallContext::directTailCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalCallContext *this,
          Own<capnp::RequestHook> *request)

{
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_capnp::Response<capnp::AnyPointer>_>
  voidPromise;
  RemotePromise<capnp::AnyPointer> promise;
  Own<kj::_::PromiseNode> local_68;
  LocalCallContext *local_58;
  RemotePromise<capnp::AnyPointer> local_50;
  
  if ((this->response).ptr.isSet != true) {
    (**request->ptr->_vptr_RequestHook)(&local_50);
    local_58 = this;
    kj::Promise<capnp::Response<capnp::AnyPointer>>::
    then<capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
              ((Promise<capnp::Response<capnp::AnyPointer>> *)&local_68,
               (anon_class_8_1_8991fb9c_for_func *)&local_50,(PropagateException *)&local_58);
    (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = local_68.disposer;
    (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_68.ptr;
    local_68.ptr = (PromiseNode *)0x0;
    (__return_storage_ptr__->pipeline).disposer = local_50.super_Pipeline.hook.disposer;
    (__return_storage_ptr__->pipeline).ptr = local_50.super_Pipeline.hook.ptr;
    local_50.super_Pipeline.hook.ptr = (PipelineHook *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_68);
    RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_50);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
            ((Fault *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x98,FAILED,"response == nullptr",
             "\"Can\'t call tailCall() after initializing the results struct.\"",
             (char (*) [61])"Can\'t call tailCall() after initializing the results struct.");
  kj::_::Debug::Fault::fatal((Fault *)&local_50);
}

Assistant:

ClientHook::VoidPromiseAndPipeline directTailCall(kj::Own<RequestHook>&& request) override {
    KJ_REQUIRE(response == nullptr, "Can't call tailCall() after initializing the results struct.");

    auto promise = request->send();

    auto voidPromise = promise.then([this](Response<AnyPointer>&& tailResponse) {
      response = kj::mv(tailResponse);
    });

    return { kj::mv(voidPromise), PipelineHook::from(kj::mv(promise)) };
  }